

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpbrk.c
# Opt level: O1

char * strpbrk(char *__s,char *__accept)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *p1;
  
  cVar2 = *__s;
  pcVar3 = __accept;
  if (cVar2 == '\0') {
LAB_00101154:
    __s = (char *)0x0;
  }
  else {
    do {
      while (cVar1 = *pcVar3, cVar1 == '\0') {
        cVar2 = __s[1];
        __s = __s + 1;
        pcVar3 = __accept;
        if (cVar2 == '\0') goto LAB_00101154;
      }
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != cVar1);
  }
  return __s;
}

Assistant:

char * strpbrk( const char * s1, const char * s2 )
{
    const char * p1 = s1;
    const char * p2;

    while ( *p1 )
    {
        p2 = s2;

        while ( *p2 )
        {
            if ( *p1 == *p2++ )
            {
                return ( char * ) p1;
            }
        }

        ++p1;
    }

    return NULL;
}